

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_APPLE_element_array(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_APPLE_element_array != 0) {
    glad_glElementPointerAPPLE = (PFNGLELEMENTPOINTERAPPLEPROC)(*load)("glElementPointerAPPLE");
    glad_glDrawElementArrayAPPLE =
         (PFNGLDRAWELEMENTARRAYAPPLEPROC)(*load)("glDrawElementArrayAPPLE");
    glad_glDrawRangeElementArrayAPPLE =
         (PFNGLDRAWRANGEELEMENTARRAYAPPLEPROC)(*load)("glDrawRangeElementArrayAPPLE");
    glad_glMultiDrawElementArrayAPPLE =
         (PFNGLMULTIDRAWELEMENTARRAYAPPLEPROC)(*load)("glMultiDrawElementArrayAPPLE");
    glad_glMultiDrawRangeElementArrayAPPLE =
         (PFNGLMULTIDRAWRANGEELEMENTARRAYAPPLEPROC)(*load)("glMultiDrawRangeElementArrayAPPLE");
  }
  return;
}

Assistant:

static void load_GL_APPLE_element_array(GLADloadproc load) {
	if(!GLAD_GL_APPLE_element_array) return;
	glad_glElementPointerAPPLE = (PFNGLELEMENTPOINTERAPPLEPROC)load("glElementPointerAPPLE");
	glad_glDrawElementArrayAPPLE = (PFNGLDRAWELEMENTARRAYAPPLEPROC)load("glDrawElementArrayAPPLE");
	glad_glDrawRangeElementArrayAPPLE = (PFNGLDRAWRANGEELEMENTARRAYAPPLEPROC)load("glDrawRangeElementArrayAPPLE");
	glad_glMultiDrawElementArrayAPPLE = (PFNGLMULTIDRAWELEMENTARRAYAPPLEPROC)load("glMultiDrawElementArrayAPPLE");
	glad_glMultiDrawRangeElementArrayAPPLE = (PFNGLMULTIDRAWRANGEELEMENTARRAYAPPLEPROC)load("glMultiDrawRangeElementArrayAPPLE");
}